

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
          (SignalTimeDependent<double,_int> *this,function2<double_&,_double_&,_int> *t,
          SignalArray_const<int> *sig,string *name)

{
  undefined1 *this_00;
  function2<double_&,_double_&,_int> local_70;
  string local_50;
  
  this_00 = &this->field_0x40;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Signal<double,_int>::Signal((Signal<double,_int> *)this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x1375c8;
  *(undefined8 *)&this->field_0x40 = 0x137738;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,(SignalBase<int> *)this_00,sig,TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x1375c8;
  *(undefined8 *)&this->field_0x40 = 0x137738;
  boost::function2<double_&,_double_&,_int>::function2(&local_70,t);
  (**(code **)(*(long *)this_00 + 0xd8))(this_00,&local_70,0);
  boost::function2<double_&,_double_&,_int>::~function2(&local_70);
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    boost::function2<T &, T &, Time> t, const SignalArray_const<Time> &sig,
    std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, sig) {
  this->setFunction(t);
}